

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void GEO::Process::enable_multithreading(bool flag)

{
  index_t iVar1;
  ostream *poVar2;
  allocator local_29;
  string local_28;
  
  if ((::(anonymous_namespace)::multithreading_initialized_ != '\x01') ||
     ((bool)::(anonymous_namespace)::multithreading_enabled_ != flag)) {
    ::(anonymous_namespace)::multithreading_initialized_ = '\x01';
    ::(anonymous_namespace)::multithreading_enabled_ = flag;
    if (flag) {
      std::__cxx11::string::string((string *)&local_28,"Process",&local_29);
      poVar2 = Logger::out(&local_28);
      poVar2 = std::operator<<(poVar2,"Multithreading enabled");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"Available cores = ");
      number_of_cores();
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_28);
      iVar1 = number_of_cores();
      if (iVar1 == 1) {
        std::__cxx11::string::string((string *)&local_28,"Process",&local_29);
        poVar2 = Logger::warn(&local_28);
        poVar2 = std::operator<<(poVar2,"Processor is not a multicore");
        poVar2 = std::operator<<(poVar2,"(or multithread is not supported)");
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&local_28);
      }
      if (::(anonymous_namespace)::thread_manager_ != 0) {
        return;
      }
      std::__cxx11::string::string((string *)&local_28,"Process",&local_29);
      poVar2 = Logger::warn(&local_28);
      poVar2 = std::operator<<(poVar2,"Missing multithreading manager");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      std::__cxx11::string::string((string *)&local_28,"Process",&local_29);
      poVar2 = Logger::out(&local_28);
      poVar2 = std::operator<<(poVar2,"Multithreading disabled");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void enable_multithreading(bool flag) {
            if(
                multithreading_initialized_ &&
                multithreading_enabled_ == flag
            ) {
                return;
            }
            multithreading_initialized_ = true;
            multithreading_enabled_ = flag;
            if(multithreading_enabled_) {
                Logger::out("Process")
                    << "Multithreading enabled" << std::endl
                    << "Available cores = " << number_of_cores()
                    << std::endl;
                // Logger::out("Process")
                //    << "Max. concurrent threads = "
                //    << maximum_concurrent_threads() << std::endl ;
                if(number_of_cores() == 1) {
                    Logger::warn("Process")
                        << "Processor is not a multicore"
			<< "(or multithread is not supported)"
                        << std::endl;
                }
                if(thread_manager_ == nullptr) {
                    Logger::warn("Process")
                        << "Missing multithreading manager"
                        << std::endl;
                }
            } else {
                Logger::out("Process")
                    << "Multithreading disabled" << std::endl;
            }
        }